

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

void __thiscall FMaskCVar::FMaskCVar(FMaskCVar *this,char *name,FIntCVar *realvar,DWORD bitval)

{
  int local_28;
  uint local_24;
  int bit;
  DWORD bitval_local;
  FIntCVar *realvar_local;
  char *name_local;
  FMaskCVar *this_local;
  
  FBaseCVar::FBaseCVar(&this->super_FBaseCVar,name,0,(_func_void_FBaseCVar_ptr *)0x0);
  (this->super_FBaseCVar)._vptr_FBaseCVar = (_func_int **)&PTR__FMaskCVar_00b69130;
  this->ValueVar = realvar;
  this->BitVal = bitval;
  (this->super_FBaseCVar).Flags = (this->super_FBaseCVar).Flags & 0xffffff7f;
  if (bitval != 0) {
    local_28 = 0;
    for (local_24 = bitval; (local_24 & 1) == 0; local_24 = local_24 >> 1) {
      local_28 = local_28 + 1;
    }
    this->BitNum = local_28;
    return;
  }
  __assert_fail("bitval != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/c_cvars.cpp"
                ,0x4a3,"FMaskCVar::FMaskCVar(const char *, FIntCVar &, DWORD)");
}

Assistant:

FMaskCVar::FMaskCVar (const char *name, FIntCVar &realvar, DWORD bitval)
: FBaseCVar (name, 0, NULL),
ValueVar (realvar),
BitVal (bitval)
{
	int bit;

	Flags &= ~CVAR_ISDEFAULT;

	assert (bitval != 0);

	bit = 0;
	while ((bitval & 1) == 0)
	{
		++bit;
		bitval >>= 1;
	}
	BitNum = bit;
}